

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_group.hpp
# Opt level: O0

void __thiscall
oqpi::
parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
::executeImpl(parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
              *this)

{
  scheduler<concurrent_queue> *hTask;
  bool bVar1;
  reference pvVar2;
  task_handle local_70;
  undefined1 local_60 [28];
  int32_t scheduledTasks;
  size_t i;
  size_type taskCount;
  parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
  *this_local;
  undefined8 local_28;
  undefined4 local_1c;
  undefined8 local_18;
  undefined8 local_10;
  
  taskCount = (size_type)this;
  i = std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::size(&this->tasks_);
  if ((i != 0) ||
     (bVar1 = assert_and_return_false
                        ("/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/parallel_group.hpp"
                         ,0x5a,"taskCount > 0","Trying to execute an empty group"), bVar1)) {
    local_60._20_4_ = 0;
    do {
      do {
        do {
          local_10 = &this->currentTaskIndex_;
          local_18 = (__pthread_internal_list *)0x1;
          local_1c = 5;
          local_28 = 1;
          LOCK();
          unique0x00006b80 =
               (parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
                *)(((atomic<unsigned_long> *)local_10)->super___atomic_base<unsigned_long>)._M_i;
          (((atomic<unsigned_long> *)local_10)->super___atomic_base<unsigned_long>)._M_i =
               (((atomic<unsigned_long> *)local_10)->super___atomic_base<unsigned_long>)._M_i + 1;
          UNLOCK();
          this_local = unique0x00006b80;
          if (i <= unique0x00006b80) goto LAB_0028f5ca;
          pvVar2 = std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::operator[]
                             (&this->tasks_,(size_type)unique0x00006b80);
          bVar1 = task_handle::isGrabbed(pvVar2);
        } while (bVar1);
        pvVar2 = std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::operator[]
                           (&this->tasks_,(size_type)stack0xffffffffffffffb8);
        bVar1 = task_handle::isDone(pvVar2);
      } while (bVar1);
      hTask = (this->
              super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
              ).scheduler_;
      pvVar2 = std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::operator[]
                         (&this->tasks_,(size_type)stack0xffffffffffffffb8);
      task_handle::task_handle(&local_70,pvVar2);
      scheduler<concurrent_queue>::add((scheduler<concurrent_queue> *)local_60,(task_handle *)hTask)
      ;
      task_handle::~task_handle((task_handle *)local_60);
      task_handle::~task_handle(&local_70);
    } while ((this->maxSimultaneousTasks_ < 1) ||
            (local_60._20_4_ = local_60._20_4_ + 1,
            (int)local_60._20_4_ < this->maxSimultaneousTasks_ + -1));
LAB_0028f5ca:
    pvVar2 = std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::operator[]
                       (&this->tasks_,0);
    bVar1 = task_handle::tryGrab(pvVar2);
    if (bVar1) {
      pvVar2 = std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::operator[]
                         (&this->tasks_,0);
      task_handle::execute(pvVar2);
    }
  }
  return;
}

Assistant:

virtual void executeImpl() override final
        {
            const auto taskCount = tasks_.size();
            if (oqpi_ensuref(taskCount > 0, "Trying to execute an empty group"))
            {
                size_t i = 0;
                int32_t scheduledTasks = 0;

                while ((i = currentTaskIndex_.fetch_add(1)) < taskCount)
                {
                    if (!tasks_[i].isGrabbed() && !tasks_[i].isDone())
                    {
                        this->scheduler_.add(tasks_[i]);
                        if (maxSimultaneousTasks_ > 0 && ++scheduledTasks >= maxSimultaneousTasks_-1)
                        {
                            break;
                        }
                    }
                }

                if (tasks_[0].tryGrab())
                {
                    tasks_[0].execute();
                }
            }
        }